

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::UnixSocket::~UnixSocket(UnixSocket *this)

{
  UnixSocket *this_local;
  
  Shutdown(this,true);
  WeakPtrFactory<perfetto::base::UnixSocket>::~WeakPtrFactory(&this->weak_ptr_factory_);
  UnixSocketRaw::~UnixSocketRaw(&this->sock_raw_);
  return;
}

Assistant:

UnixSocket::~UnixSocket() {
  // The implicit dtor of |weak_ptr_factory_| will no-op pending callbacks.
  Shutdown(true);
}